

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void arm::display_op(OpCode op,ostream *o)

{
  long lVar1;
  char *pcVar2;
  
  switch(op) {
  case Nop:
    pcVar2 = "nop";
    break;
  case B:
    pcVar2 = "b";
    lVar1 = 1;
    goto LAB_001b328e;
  case Bl:
    pcVar2 = "bl";
    goto LAB_001b320e;
  case Bx:
    pcVar2 = "bx";
LAB_001b320e:
    lVar1 = 2;
    goto LAB_001b328e;
  case Cbz:
    pcVar2 = "cbz";
    break;
  case Cbnz:
    pcVar2 = "cbnz";
    goto LAB_001b3269;
  case Mov:
    pcVar2 = "mov";
    break;
  case MovT:
    pcVar2 = "movt";
    goto LAB_001b3269;
  case Mvn:
    pcVar2 = "mvn";
    break;
  case Add:
    pcVar2 = "add";
    break;
  case Sub:
    pcVar2 = "sub";
    break;
  case Rsb:
    pcVar2 = "rsb";
    break;
  case Mul:
    pcVar2 = "mul";
    break;
  case SMMul:
    pcVar2 = "smmul";
    goto LAB_001b322e;
  case Mla:
    pcVar2 = "mla";
    break;
  case SMMla:
    pcVar2 = "smmla";
LAB_001b322e:
    lVar1 = 5;
    goto LAB_001b328e;
  case SDiv:
    pcVar2 = "sdiv";
    goto LAB_001b3269;
  case And:
    pcVar2 = "and";
    break;
  case Orr:
    pcVar2 = "orr";
    break;
  case Eor:
    pcVar2 = "eor";
    break;
  case Bic:
    pcVar2 = "bic";
    break;
  case Lsl:
    pcVar2 = "lsl";
    break;
  case Lsr:
    pcVar2 = "lsr";
    break;
  case Asr:
    pcVar2 = "asr";
    break;
  case Cmp:
    pcVar2 = "cmp";
    break;
  case Cmn:
    pcVar2 = "cmn";
    break;
  case LdR:
    pcVar2 = "ldr";
    break;
  case LdM:
    pcVar2 = "ldm";
    break;
  case StR:
    pcVar2 = "str";
    break;
  case StM:
    pcVar2 = "stm";
    break;
  case Push:
    pcVar2 = "push";
    goto LAB_001b3269;
  case Pop:
    pcVar2 = "pop";
    break;
  case _Label:
    return;
  default:
    std::__ostream_insert<char,std::char_traits<char>>(o,"?",1);
    std::ostream::operator<<(o,op);
    return;
  case _Mod:
    pcVar2 = "_MOD";
LAB_001b3269:
    lVar1 = 4;
    goto LAB_001b328e;
  }
  lVar1 = 3;
LAB_001b328e:
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
  return;
}

Assistant:

void display_op(OpCode op, std::ostream &o) {
  switch (op) {
    case OpCode::Nop:
      o << "nop";
      break;
    case OpCode::B:
      o << "b";
      break;
    case OpCode::Bl:
      o << "bl";
      break;
    case OpCode::Bx:
      o << "bx";
      break;
    case OpCode::Cbz:
      o << "cbz";
      break;
    case OpCode::Cbnz:
      o << "cbnz";
      break;
    case OpCode::Mov:
      o << "mov";
      break;
    case OpCode::MovT:
      o << "movt";
      break;
    case OpCode::Mvn:
      o << "mvn";
      break;
    case OpCode::Add:
      o << "add";
      break;
    case OpCode::Sub:
      o << "sub";
      break;
    case OpCode::Rsb:
      o << "rsb";
      break;
    case OpCode::Mul:
      o << "mul";
      break;
    case OpCode::SMMul:
      o << "smmul";
      break;
    case OpCode::Mla:
      o << "mla";
      break;
    case OpCode::SMMla:
      o << "smmla";
      break;
    case OpCode::SDiv:
      o << "sdiv";
      break;
    case OpCode::Lsl:
      o << "lsl";
      break;
    case OpCode::Lsr:
      o << "lsr";
      break;
    case OpCode::Asr:
      o << "asr";
      break;
    case OpCode::And:
      o << "and";
      break;
    case OpCode::Orr:
      o << "orr";
      break;
    case OpCode::Eor:
      o << "eor";
      break;
    case OpCode::Bic:
      o << "bic";
      break;
    case OpCode::Cmp:
      o << "cmp";
      break;
    case OpCode::Cmn:
      o << "cmn";
      break;
    case OpCode::LdR:
      o << "ldr";
      break;
    case OpCode::LdM:
      o << "ldm";
      break;
    case OpCode::StR:
      o << "str";
      break;
    case OpCode::StM:
      o << "stm";
      break;
    case OpCode::Push:
      o << "push";
      break;
    case OpCode::Pop:
      o << "pop";
      break;
    case OpCode::_Label:
      // Labels are pseudo-instructions
      break;
    case OpCode::_Mod:
      o << "_MOD";
      break;
    default:
      o << "?" << (int)op;
      break;
  }
}